

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXExporter::WriteConnections(FBXExporter *this)

{
  bool bVar1;
  bool bVar2;
  reference this_00;
  Node *n;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_> *__range1;
  undefined1 local_118 [8];
  StreamWriterLE outstream;
  string local_d8;
  undefined1 local_b8 [8];
  Node conn;
  allocator<char> local_31;
  string local_30;
  FBXExporter *local_10;
  FBXExporter *this_local;
  
  local_10 = this;
  if ((this->binary & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Object connections",&local_31);
    WriteAsciiSectionHeader(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Connections",(allocator<char> *)((long)&outstream.cursor + 7));
  FBX::Node::Node((Node *)local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&outstream.cursor + 7));
  std::shared_ptr<Assimp::IOStream>::shared_ptr
            ((shared_ptr<Assimp::IOStream> *)&__range1,&this->outfile);
  StreamWriter<false,_false>::StreamWriter
            ((StreamWriter<false,_false> *)local_118,(shared_ptr<Assimp::IOStream> *)&__range1,false
            );
  std::shared_ptr<Assimp::IOStream>::~shared_ptr((shared_ptr<Assimp::IOStream> *)&__range1);
  FBX::Node::Begin((Node *)local_b8,(StreamWriterLE *)local_118,(bool)(this->binary & 1),0);
  FBX::Node::BeginChildren((Node *)local_b8,(StreamWriterLE *)local_118,(bool)(this->binary & 1),0);
  __end1 = std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::begin
                     (&this->connections);
  n = (Node *)std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::end
                        (&this->connections);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Assimp::FBX::Node_*,_std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>_>
                                *)&n);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<Assimp::FBX::Node_*,_std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>_>
              ::operator*(&__end1);
    FBX::Node::Dump(this_00,(StreamWriterLE *)local_118,(bool)(this->binary & 1),1);
    __gnu_cxx::
    __normal_iterator<Assimp::FBX::Node_*,_std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>_>
    ::operator++(&__end1);
  }
  bVar1 = this->binary;
  bVar2 = std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::empty
                    (&this->connections);
  FBX::Node::End((Node *)local_b8,(StreamWriterLE *)local_118,(bool)(bVar1 & 1),0,!bVar2);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::clear(&this->connections);
  StreamWriter<false,_false>::~StreamWriter((StreamWriter<false,_false> *)local_118);
  FBX::Node::~Node((Node *)local_b8);
  return;
}

Assistant:

void FBXExporter::WriteConnections ()
{
    // we should have completed the connection graph already,
    // so basically just dump it here
    if (!binary) {
        WriteAsciiSectionHeader("Object connections");
    }
    // TODO: comments with names in the ascii version
    FBX::Node conn("Connections");
    StreamWriterLE outstream(outfile);
    conn.Begin(outstream, binary, 0);
    conn.BeginChildren(outstream, binary, 0);
    for (auto &n : connections) {
        n.Dump(outstream, binary, 1);
    }
    conn.End(outstream, binary, 0, !connections.empty());
    connections.clear();
}